

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O1

void __thiscall
Script_GetWitnessScriptHash_Test::~Script_GetWitnessScriptHash_Test
          (Script_GetWitnessScriptHash_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, GetWitnessScriptHash) {
  Script script(
      "002096376230fbeec4d1e703c3a2d1efe975ccf650a40f6ca2ec2d6cce44fc6bb2b3");
  ScriptHash script_hash = script.GetWitnessScriptHash();
  EXPECT_STREQ(
      script_hash.GetHex().c_str(),
      "00206bb5cc76cdbd684cb6f7c43a98c61c5aa789368d5e319e6c8258de3fec796562");
}